

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::QuantizationParams::MergePartialFromCodedStream
          (QuantizationParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint32 uVar8;
  LinearQuantizationParams *this_00;
  ulong extraout_RAX;
  LookUpTableQuantizationParams *this_01;
  ulong extraout_RAX_00;
  char cVar9;
  ulong uVar10;
  pair<unsigned_long,_bool> pVar11;
  int local_38;
  int local_34;
  
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar10 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar7 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar8 = uVar7, (~(uint)*pbVar1 & uVar7) < 0x80))
        goto LAB_004916f9;
        uVar10 = (ulong)((uVar7 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar10 = uVar10 | 0x100000000;
    }
    else {
LAB_004916f9:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar10 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar8 | uVar10;
    }
    uVar8 = (uint32)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto LAB_00491578;
    uVar7 = (uint)(uVar10 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar10;
    if (uVar7 == 0x66) {
      if (cVar9 != '2') goto LAB_00491578;
      if (this->_oneof_case_[0] != 0x66) {
        clear_QuantizationType(this);
        this->_oneof_case_[0] = 0x66;
        this_01 = (LookUpTableQuantizationParams *)operator_new(0x28);
        LookUpTableQuantizationParams::LookUpTableQuantizationParams(this_01);
        (this->QuantizationType_).lookuptablequantization_ = this_01;
      }
      MergePartialFromCodedStream();
      iVar6 = local_38;
      if ((extraout_RAX_00 & 1) == 0) goto LAB_004915a1;
    }
    else if (uVar7 == 0x65) {
      if (cVar9 == '*') {
        if (this->_oneof_case_[0] != 0x65) {
          clear_QuantizationType(this);
          this->_oneof_case_[0] = 0x65;
          this_00 = (LinearQuantizationParams *)operator_new(0x40);
          LinearQuantizationParams::LinearQuantizationParams(this_00);
          (this->QuantizationType_).linearquantization_ = this_00;
        }
        MergePartialFromCodedStream();
        iVar6 = local_34;
        if ((extraout_RAX & 1) != 0) goto LAB_004915a3;
        goto LAB_004915a1;
      }
LAB_00491578:
      iVar6 = 7;
      if ((uVar8 & 7) != 4 && uVar8 != 0) {
        bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar8);
        if (bVar5) goto LAB_004915a1;
LAB_004916ef:
        iVar6 = 6;
      }
    }
    else {
      if ((uVar7 != 1) || (cVar9 != '\b')) goto LAB_00491578;
      puVar4 = input->buffer_;
      if ((input->buffer_end_ <= puVar4) || ((long)(char)*puVar4 < 0)) {
        pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->numberofbits_ = pVar11.first;
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_004915a1;
        goto LAB_004916ef;
      }
      this->numberofbits_ = (long)(char)*puVar4;
      input->buffer_ = puVar4 + 1;
LAB_004915a1:
      iVar6 = 0;
    }
LAB_004915a3:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool QuantizationParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.QuantizationParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 numberOfBits = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &numberofbits_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LinearQuantizationParams linearQuantization = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_linearquantization()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LookUpTableQuantizationParams lookupTableQuantization = 102;
      case 102: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(818u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_lookuptablequantization()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.QuantizationParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.QuantizationParams)
  return false;
#undef DO_
}